

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O2

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadQuaternion(OgreBinarySerializer *this,aiQuaternion *quat)

{
  float temp [4];
  
  StreamReader<false,_false>::CopyAndAdvance(this->m_reader,temp,0x10);
  quat->w = temp[3];
  quat->x = temp[0];
  quat->y = temp[1];
  quat->z = temp[2];
  return;
}

Assistant:

void OgreBinarySerializer::ReadQuaternion(aiQuaternion &quat)
{
    float temp[4];
    m_reader->CopyAndAdvance(temp, sizeof(float)*4);
    quat.x = temp[0];
    quat.y = temp[1];
    quat.z = temp[2];
    quat.w = temp[3];
}